

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

int Abc_NamStrFindOrAddLim(Abc_Nam_t *p,char *pStr,char *pLim,int *pfFound)

{
  int *piVar1;
  char *__ptr;
  int iVar2;
  int iVar3;
  size_t __n;
  
  if (pStr < pLim) {
    piVar1 = Abc_NamStrHashFind(p,pStr,pLim);
    iVar3 = *piVar1;
    if (iVar3 == 0) {
      if (pfFound != (int *)0x0) {
        *pfFound = 0;
      }
      iVar3 = p->nStore;
      __n = (long)pLim - (long)pStr;
      iVar2 = (int)__n + p->iHandle + 1;
      __ptr = p->pStore;
      while (iVar3 < iVar2) {
        iVar3 = (iVar3 * 3) / 2;
        p->nStore = iVar3;
        if (__ptr == (char *)0x0) {
          __ptr = (char *)malloc((long)iVar3);
        }
        else {
          __ptr = (char *)realloc(__ptr,(long)iVar3);
          iVar3 = p->nStore;
        }
        p->pStore = __ptr;
      }
      *piVar1 = (p->vInt2Handle).nSize;
      iVar3 = p->iHandle;
      strncpy(__ptr + iVar3,pStr,__n);
      (__ptr + iVar3)[__n] = '\0';
      Vec_IntPush(&p->vInt2Handle,p->iHandle);
      Vec_IntPush(&p->vInt2Next,0);
      p->iHandle = iVar2;
      iVar3 = (p->vInt2Handle).nSize;
      if (p->nBins * 2 < iVar3) {
        Abc_NamStrHashResize(p);
        iVar3 = (p->vInt2Handle).nSize;
      }
      iVar3 = iVar3 + -1;
    }
    else if (pfFound != (int *)0x0) {
      *pfFound = 1;
      iVar3 = *piVar1;
    }
    return iVar3;
  }
  __assert_fail("pStr < pLim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x1b6,"int Abc_NamStrFindOrAddLim(Abc_Nam_t *, char *, char *, int *)");
}

Assistant:

int Abc_NamStrFindOrAddLim( Abc_Nam_t * p, char * pStr, char * pLim, int * pfFound )
{
    int iHandleNew;
    int *piPlace;
    char * pStore;
    assert( pStr < pLim );
    piPlace = Abc_NamStrHashFind( p, pStr, pLim );
    if ( *piPlace )
    {
        if ( pfFound )
            *pfFound = 1;
        return *piPlace;
    }
    if ( pfFound )
        *pfFound = 0;
    iHandleNew = p->iHandle + (pLim - pStr) + 1;
    while ( p->nStore < iHandleNew )
    {
        p->nStore *= 3;
        p->nStore /= 2;
        p->pStore  = ABC_REALLOC( char, p->pStore, p->nStore );
    }
    assert( p->nStore >= iHandleNew );
    // create new handle
    *piPlace = Vec_IntSize( &p->vInt2Handle );
    pStore = Abc_NamHandleToStr( p, p->iHandle );
    strncpy( pStore, pStr, pLim - pStr );
    pStore[pLim - pStr] = 0;
    Vec_IntPush( &p->vInt2Handle, p->iHandle );
    Vec_IntPush( &p->vInt2Next, 0 );
    p->iHandle = iHandleNew;
    // extend the hash table
    if ( Vec_IntSize(&p->vInt2Handle) > 2 * p->nBins )
        Abc_NamStrHashResize( p );
    return Vec_IntSize(&p->vInt2Handle) - 1;
}